

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[10],int&>
          (String *__return_storage_ptr__,kj *this,char (*params) [10],int *params_1)

{
  kj *local_48;
  size_t local_40;
  CappedArray<char,_14UL> local_38;
  
  local_40 = strlen((char *)this);
  local_48 = this;
  _::Stringifier::operator*(&local_38,(Stringifier *)&_::STR,*(int *)*params);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_48,(ArrayPtr<const_char> *)&local_38,
             (CappedArray<char,_14UL> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}